

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *pNtk)

{
  char *pSop;
  int *pArray;
  uint uVar1;
  uint nSize;
  int iVar2;
  int Entry;
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  ulong uVar5;
  int Fill;
  int Fill_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  int i;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x13d,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
  }
  iVar2 = 100;
  p = Vec_StrAlloc(100);
  p_00 = Vec_IntAlloc(iVar2);
  p_01 = Vec_IntAlloc(iVar2);
  p_02 = Vec_IntAlloc(iVar2);
  i = 0;
  p_03 = Vec_IntAlloc(iVar2);
  do {
    if (pNtk->vObjs->nSize <= i) {
      Vec_IntFree(p_03);
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      Vec_IntFree(p_00);
      Vec_StrFree(p);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,i);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      pSop = (char *)(pAVar3->field_5).pData;
      nSize = Abc_SopGetVarNum(pSop);
      if (nSize != (pAVar3->vFanins).nSize) {
        __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                      ,0x147,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
      }
      Vec_IntFill(p_01,nSize,Fill);
      Vec_IntFill(p_03,nSize,Fill_00);
      iVar2 = nSize + 3;
      iVar7 = 0;
      uVar1 = nSize;
      if ((int)nSize < 1) {
        uVar1 = 0;
      }
      uVar9 = (ulong)uVar1;
      uVar6 = extraout_RDX;
      for (pcVar10 = pSop; *pcVar10 != '\0'; pcVar10 = pcVar10 + iVar2) {
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          if (pcVar10[uVar11] != '-') {
            Vec_IntAddToEntry(p_01,(int)uVar11,(int)uVar6);
            Vec_IntWriteEntry(p_03,(int)uVar11,iVar7);
            uVar6 = extraout_RDX_00;
          }
        }
        iVar7 = iVar7 + 1;
      }
      uVar11 = 0;
      for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
        iVar7 = Vec_IntEntry(p_01,uVar8);
        Entry = 1000000000;
        if (iVar7 == 1) {
          Entry = Vec_IntEntry(p_03,uVar8);
        }
        Vec_IntWriteEntry(p_01,uVar8,Entry);
      }
      p_00->nSize = 0;
      for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
        Vec_IntPush(p_00,uVar8);
      }
      pArray = p_00->pArray;
      Vec_IntSelectSortCost(pArray,nSize,p_01);
      iVar7 = Abc_SopGetCubeNum(pSop);
      Vec_StrGrow(p,iVar7 * iVar2 + 1);
      pcVar10 = p->pArray;
      iVar7 = Abc_SopGetCubeNum(pSop);
      memcpy(pcVar10,pSop,(long)(iVar7 * iVar2 + 1));
      pcVar4 = pSop;
      for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + iVar2) {
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          pcVar4[uVar5] = '-';
        }
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          if ((pcVar10[pArray[uVar5]] & 0xfeU) == 0x30) {
            pcVar4[uVar5] = pcVar10[pArray[uVar5]];
          }
        }
        pcVar4 = pcVar4 + iVar2;
      }
      (pAVar3->field_5).pData = pSop;
      p_02->nSize = 0;
      for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        Vec_IntPush(p_02,(pAVar3->vFanins).pArray[pArray[uVar11]]);
      }
      (pAVar3->vFanins).nSize = 0;
      Vec_IntAppend(&pAVar3->vFanins,p_02);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkOrderFaninsByLitCountAndCubeCount( Abc_Ntk_t * pNtk )
{
    // assuming that the fanins are sorted by the number of literals in each cube
    // this procedure sorts the literals appearing only once by the number of their cube
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Int_t * vCubeNum;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, iCube, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vStore = Vec_StrAlloc( 100 );
    vOrder = Vec_IntAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    vCubeNum = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals and remember the cube where each literal appears
        Vec_IntFill( vCounts, nVars, 0 );
        Vec_IntFill( vCubeNum, nVars, 0 );
        iCube = 0;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                {
                    Vec_IntAddToEntry( vCounts, v, 1 );
                    Vec_IntWriteEntry( vCubeNum, v, iCube );
                }
            iCube++;
        }
        // create new order
        for ( v = 0; v < nVars; v++ )
            if ( Vec_IntEntry(vCounts, v) == 1 )
                Vec_IntWriteEntry( vCounts, v, Vec_IntEntry(vCubeNum, v) );
            else
                Vec_IntWriteEntry( vCounts, v, ABC_INFINITY );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vCubeNum );
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}